

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t assertion_make_hardlink(char *file,wchar_t line,char *newpath,char *linkto)

{
  int iVar1;
  wchar_t succeeded;
  char *linkto_local;
  char *newpath_local;
  wchar_t line_local;
  char *file_local;
  
  assertion_count(file,line);
  iVar1 = link(linkto,newpath);
  if (iVar1 != 0) {
    failure_start(file,line,"Could not create hardlink");
    logprintf("   New link: %s\n",newpath);
    logprintf("   Old name: %s\n",linkto);
    failure_finish((void *)0x0);
  }
  file_local._4_4_ = (wchar_t)(iVar1 == 0);
  return file_local._4_4_;
}

Assistant:

int
assertion_make_hardlink(const char *file, int line,
    const char *newpath, const char *linkto)
{
	int succeeded;

	assertion_count(file, line);
#if defined(_WIN32) && !defined(__CYGWIN__)
	succeeded = my_CreateHardLinkA(newpath, linkto);
#elif HAVE_LINK
	succeeded = !link(linkto, newpath);
#else
	succeeded = 0;
#endif
	if (succeeded)
		return (1);
	failure_start(file, line, "Could not create hardlink");
	logprintf("   New link: %s\n", newpath);
	logprintf("   Old name: %s\n", linkto);
	failure_finish(NULL);
	return(0);
}